

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

void JS_AddIntrinsicTypedArrays(JSContext *ctx)

{
  int iVar1;
  JSValue *pJVar2;
  ulong uVar3;
  char *name;
  JSAtom atom;
  long lVar4;
  long lVar5;
  JSRefCountHeader *p_1;
  int64_t in_R9;
  int64_t iVar6;
  JSRefCountHeader *p;
  JSValue JVar7;
  JSValue JVar8;
  JSValue JVar9;
  JSValue val;
  JSValue proto;
  JSValue val_00;
  JSValue proto_00;
  char buf [64];
  JSValueUnion local_98;
  JSValueUnion local_88;
  char local_78 [72];
  
  pJVar2 = ctx->class_proto;
  JVar7 = JS_NewObjectProtoClass(ctx,pJVar2[1],1);
  pJVar2[0x13] = JVar7;
  JS_SetPropertyFunctionList(ctx,ctx->class_proto[0x13],js_array_buffer_proto_funcs,3);
  JVar7.tag = in_R9;
  JVar7.u = (JSValueUnion)(JSValueUnion)ctx->class_proto[0x13].tag;
  JVar7 = JS_NewGlobalCConstructorOnly
                    (ctx,"ArrayBuffer",js_array_buffer_constructor,ctx->class_proto[0x13].u.int32,
                     JVar7);
  JS_SetPropertyFunctionList(ctx,JVar7,js_array_buffer_funcs,2);
  pJVar2 = ctx->class_proto;
  JVar7 = JS_NewObjectProtoClass(ctx,pJVar2[1],1);
  pJVar2[0x14] = JVar7;
  JS_SetPropertyFunctionList(ctx,ctx->class_proto[0x14],js_shared_array_buffer_proto_funcs,3);
  JVar8.tag = in_R9;
  JVar8.u = (JSValueUnion)(JSValueUnion)ctx->class_proto[0x14].tag;
  JVar7 = JS_NewGlobalCConstructorOnly
                    (ctx,"SharedArrayBuffer",js_shared_array_buffer_constructor,
                     ctx->class_proto[0x14].u.int32,JVar8);
  JS_SetPropertyFunctionList(ctx,JVar7,js_shared_array_buffer_funcs,1);
  JVar7 = JS_NewObjectProtoClass(ctx,ctx->class_proto[1],1);
  JS_SetPropertyFunctionList(ctx,JVar7,js_typed_array_base_proto_funcs,0x1e);
  JVar8 = JS_GetPropertyInternal(ctx,ctx->class_proto[2],0x37,ctx->class_proto[2],0);
  JS_DefinePropertyValue(ctx,JVar7,0x37,JVar8,3);
  JVar8 = JS_NewCFunction3(ctx,js_typed_array_base_constructor,"TypedArray",0,JS_CFUNC_generic,0,
                           ctx->function_proto);
  JS_SetPropertyFunctionList(ctx,JVar8,js_typed_array_base_funcs,3);
  JS_SetConstructor2(ctx,JVar8,JVar7,0,3);
  lVar5 = 0x158;
  lVar4 = 0;
  do {
    local_98 = JVar8.u;
    local_88 = JVar7.u;
    pJVar2 = ctx->class_proto;
    JVar9 = JS_NewObjectProtoClass(ctx,JVar7,1);
    *(JSValueUnion *)((long)pJVar2 + lVar5 + -8) = JVar9.u;
    *(int64_t *)((long)&pJVar2->u + lVar5) = JVar9.tag;
    uVar3 = 1L << (""[lVar4] & 0x3f);
    atom = 0x17a491;
    JVar9.tag = *(int64_t *)((long)&ctx->class_proto->u + lVar5);
    JVar9.u.ptr = ((JSValueUnion *)((long)ctx->class_proto + lVar5 + -8))->ptr;
    val.tag = 0;
    val.u.ptr = (void *)uVar3;
    JS_DefinePropertyValueStr(ctx,JVar9,"BYTES_PER_ELEMENT",val,0);
    name = JS_AtomGetStrRT(ctx->rt,local_78,(int)lVar4 + 0xa0,atom);
    JVar9 = JS_NewCFunction3(ctx,js_typed_array_constructor,name,3,JS_CFUNC_constructor_magic,
                             (int)lVar4 + 0x15,JVar8);
    proto.tag = *(int64_t *)((long)&ctx->class_proto->u + lVar5);
    proto.u.ptr = ((JSValueUnion *)((long)ctx->class_proto + lVar5 + -8))->ptr;
    JS_NewGlobalCConstructor2(ctx,JVar9,name,proto);
    iVar6 = 0;
    val_00.tag = 0;
    val_00.u.ptr = (void *)uVar3;
    JS_DefinePropertyValueStr(ctx,JVar9,"BYTES_PER_ELEMENT",val_00,0);
    lVar4 = lVar4 + 1;
    lVar5 = lVar5 + 0x10;
  } while (lVar4 != 9);
  if ((0xfffffff4 < (uint)JVar7.tag) &&
     (iVar1 = *local_88.ptr, *(int *)local_88.ptr = iVar1 + -1, iVar1 < 2)) {
    __JS_FreeValueRT(ctx->rt,JVar7);
  }
  if ((0xfffffff4 < (uint)JVar8.tag) &&
     (iVar1 = *local_98.ptr, *(int *)local_98.ptr = iVar1 + -1, iVar1 < 2)) {
    __JS_FreeValueRT(ctx->rt,JVar8);
  }
  pJVar2 = ctx->class_proto;
  JVar7 = JS_NewObjectProtoClass(ctx,pJVar2[1],1);
  pJVar2[0x1e] = JVar7;
  JS_SetPropertyFunctionList(ctx,ctx->class_proto[0x1e],js_dataview_proto_funcs,0x14);
  proto_00.tag = iVar6;
  proto_00.u = (JSValueUnion)(JSValueUnion)ctx->class_proto[0x1e].tag;
  JS_NewGlobalCConstructorOnly
            (ctx,"DataView",js_dataview_constructor,ctx->class_proto[0x1e].u.int32,proto_00);
  JS_SetPropertyFunctionList(ctx,ctx->global_obj,js_atomics_obj,1);
  return;
}

Assistant:

void JS_AddIntrinsicTypedArrays(JSContext *ctx)
{
    JSValue typed_array_base_proto, typed_array_base_func;
    JSValueConst array_buffer_func, shared_array_buffer_func;
    int i;

    ctx->class_proto[JS_CLASS_ARRAY_BUFFER] = JS_NewObject(ctx);
    JS_SetPropertyFunctionList(ctx, ctx->class_proto[JS_CLASS_ARRAY_BUFFER],
                               js_array_buffer_proto_funcs,
                               countof(js_array_buffer_proto_funcs));

    array_buffer_func = JS_NewGlobalCConstructorOnly(ctx, "ArrayBuffer",
                                                 js_array_buffer_constructor, 1,
                                                 ctx->class_proto[JS_CLASS_ARRAY_BUFFER]);
    JS_SetPropertyFunctionList(ctx, array_buffer_func,
                               js_array_buffer_funcs,
                               countof(js_array_buffer_funcs));

    ctx->class_proto[JS_CLASS_SHARED_ARRAY_BUFFER] = JS_NewObject(ctx);
    JS_SetPropertyFunctionList(ctx, ctx->class_proto[JS_CLASS_SHARED_ARRAY_BUFFER],
                               js_shared_array_buffer_proto_funcs,
                               countof(js_shared_array_buffer_proto_funcs));

    shared_array_buffer_func = JS_NewGlobalCConstructorOnly(ctx, "SharedArrayBuffer",
                                                 js_shared_array_buffer_constructor, 1,
                                                 ctx->class_proto[JS_CLASS_SHARED_ARRAY_BUFFER]);
    JS_SetPropertyFunctionList(ctx, shared_array_buffer_func,
                               js_shared_array_buffer_funcs,
                               countof(js_shared_array_buffer_funcs));

    typed_array_base_proto = JS_NewObject(ctx);
    JS_SetPropertyFunctionList(ctx, typed_array_base_proto,
                               js_typed_array_base_proto_funcs,
                               countof(js_typed_array_base_proto_funcs));

    /* TypedArray.prototype.toString must be the same object as Array.prototype.toString */
    JSValue obj = JS_GetProperty(ctx, ctx->class_proto[JS_CLASS_ARRAY], JS_ATOM_toString);
    /* XXX: should use alias method in JSCFunctionListEntry */ //@@@
    JS_DefinePropertyValue(ctx, typed_array_base_proto, JS_ATOM_toString, obj,
                           JS_PROP_WRITABLE | JS_PROP_CONFIGURABLE);

    typed_array_base_func = JS_NewCFunction(ctx, js_typed_array_base_constructor,
                                            "TypedArray", 0);
    JS_SetPropertyFunctionList(ctx, typed_array_base_func,
                               js_typed_array_base_funcs,
                               countof(js_typed_array_base_funcs));
    JS_SetConstructor(ctx, typed_array_base_func, typed_array_base_proto);

    for(i = JS_CLASS_UINT8C_ARRAY; i < JS_CLASS_UINT8C_ARRAY + JS_TYPED_ARRAY_COUNT; i++) {
        JSValue func_obj;
        char buf[ATOM_GET_STR_BUF_SIZE];
        const char *name;

        ctx->class_proto[i] = JS_NewObjectProto(ctx, typed_array_base_proto);
        JS_DefinePropertyValueStr(ctx, ctx->class_proto[i],
                                  "BYTES_PER_ELEMENT",
                                  JS_NewInt32(ctx, 1 << typed_array_size_log2(i)),
                                  0);
        name = JS_AtomGetStr(ctx, buf, sizeof(buf),
                             JS_ATOM_Uint8ClampedArray + i - JS_CLASS_UINT8C_ARRAY);
        func_obj = JS_NewCFunction3(ctx, (JSCFunction *)js_typed_array_constructor,
                                    name, 3, JS_CFUNC_constructor_magic, i,
                                    typed_array_base_func);
        JS_NewGlobalCConstructor2(ctx, func_obj, name, ctx->class_proto[i]);
        JS_DefinePropertyValueStr(ctx, func_obj,
                                  "BYTES_PER_ELEMENT",
                                  JS_NewInt32(ctx, 1 << typed_array_size_log2(i)),
                                  0);
    }
    JS_FreeValue(ctx, typed_array_base_proto);
    JS_FreeValue(ctx, typed_array_base_func);

    /* DataView */
    ctx->class_proto[JS_CLASS_DATAVIEW] = JS_NewObject(ctx);
    JS_SetPropertyFunctionList(ctx, ctx->class_proto[JS_CLASS_DATAVIEW],
                               js_dataview_proto_funcs,
                               countof(js_dataview_proto_funcs));
    JS_NewGlobalCConstructorOnly(ctx, "DataView",
                                 js_dataview_constructor, 1,
                                 ctx->class_proto[JS_CLASS_DATAVIEW]);
    /* Atomics */
#ifdef CONFIG_ATOMICS
    JS_AddIntrinsicAtomics(ctx);
#endif
}